

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool infoOnly;
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  string *psVar5;
  Bounds lBounds;
  Bounds kBounds;
  Bounds jBounds;
  Bounds iBounds;
  string directory;
  string basename;
  string savepointId;
  string filepath;
  string l;
  string k;
  string field;
  string j;
  string i;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (argc < 2) {
    printHelp();
    return 0;
  }
  std::__cxx11::string::string((string *)&i,":",(allocator *)&j);
  std::__cxx11::string::string((string *)&j,":",(allocator *)&k);
  std::__cxx11::string::string((string *)&k,":",(allocator *)&l);
  std::__cxx11::string::string((string *)&l,":",(allocator *)&filepath);
  infoOnly = false;
switchD_0011874a_caseD_6d:
  iVar2 = getopt(argc,argv,"i:j:k:l:q:h");
  psVar5 = &j;
  switch(iVar2) {
  case 0x68:
    goto switchD_0011874a_caseD_68;
  case 0x69:
    psVar5 = &i;
    break;
  case 0x6a:
    break;
  case 0x6b:
    psVar5 = &k;
    break;
  case 0x6c:
    psVar5 = &l;
    break;
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
    goto switchD_0011874a_caseD_6d;
  case 0x71:
    infoOnly = true;
    goto switchD_0011874a_caseD_6d;
  default:
    goto switchD_0011874a_default;
  }
  std::__cxx11::string::assign((char *)psVar5);
  goto switchD_0011874a_caseD_6d;
switchD_0011874a_default:
  if (iVar2 == -1) {
    std::__cxx11::string::string((string *)&local_50,(string *)&i);
    iBounds = string2bounds(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,(string *)&j);
    jBounds = string2bounds(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_90,(string *)&k);
    kBounds = string2bounds(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_b0,(string *)&l);
    lBounds = string2bounds(&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    lVar3 = (long)_optind;
    _optind = _optind + 1;
    std::__cxx11::string::string((string *)&filepath,argv[lVar3],(allocator *)&savepointId);
    lVar3 = (long)_optind;
    _optind = _optind + 1;
    std::__cxx11::string::string((string *)&savepointId,argv[lVar3],(allocator *)&directory);
    directory._M_dataplus._M_p = (pointer)&directory.field_2;
    directory._M_string_length = 0;
    basename._M_dataplus._M_p = (pointer)&basename.field_2;
    basename._M_string_length = 0;
    directory.field_2._M_local_buf[0] = '\0';
    basename.field_2._M_local_buf[0] = '\0';
    field._M_dataplus._M_p = (pointer)&field.field_2;
    field._M_string_length = 0;
    field.field_2._M_local_buf[0] = '\0';
    bVar1 = splitFilePath(&filepath,&directory,&basename,&field);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Directory: ");
      poVar4 = std::operator<<(poVar4,(string *)&directory);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"Basename: ");
      poVar4 = std::operator<<(poVar4,(string *)&basename);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"SavepointId: ");
      poVar4 = std::operator<<(poVar4,(string *)&savepointId);
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar2 = dump(&directory,&basename,&field,&savepointId,&iBounds,&jBounds,&kBounds,&lBounds,
                   infoOnly);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Invalid file: ");
      poVar4 = std::operator<<(poVar4,(string *)&filepath);
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar2 = 2;
    }
    std::__cxx11::string::~string((string *)&field);
    std::__cxx11::string::~string((string *)&basename);
    std::__cxx11::string::~string((string *)&directory);
    std::__cxx11::string::~string((string *)&savepointId);
    std::__cxx11::string::~string((string *)&filepath);
    goto LAB_00118a23;
  }
  goto switchD_0011874a_caseD_6d;
switchD_0011874a_caseD_68:
  iVar2 = 0;
  printHelp();
LAB_00118a23:
  std::__cxx11::string::~string((string *)&l);
  std::__cxx11::string::~string((string *)&k);
  std::__cxx11::string::~string((string *)&j);
  std::__cxx11::string::~string((string *)&i);
  return iVar2;
}

Assistant:

int main (int argc, char **argv) {

	if (argc < 2)
	{
		printHelp();
		return 0;
	}

	int opt;
	std::string i = ":";
	std::string j = ":";
	std::string k = ":";
	std::string l = ":";
	bool infoOnly = false;
	while ( (opt = getopt(argc, argv, "i:j:k:l:q:h")) != -1) {
		switch (opt)
		{
		case 'i':
			i = optarg;
			break;
		case 'j':
			j = optarg;
			break;
		case 'k':
			k = optarg;
			break;
		case 'l':
			l = optarg;
			break;
		case 'q':
			infoOnly = true;
			break;
		case 'h':
			printHelp();
			return 0;
		}
	}

	Bounds iBounds = string2bounds(i);
	Bounds jBounds = string2bounds(j);
	Bounds kBounds = string2bounds(k);
	Bounds lBounds = string2bounds(l);

	std::string filepath = argv[optind++];
	std::string savepointId = argv[optind++];

	std::string directory;
	std::string basename;
	std::string field;
	if (!splitFilePath(filepath, directory, basename, field))
	{
		std::cerr << "Invalid file: " << filepath << std::endl;
		return 2;
	}

	std::cout << "Directory: " << directory << std::endl;
	std::cout << "Basename: " << basename << std::endl;
	std::cout << "SavepointId: " << savepointId << std::endl;

	return dump(directory, basename, field, savepointId,
	            iBounds, jBounds, kBounds, lBounds, infoOnly);
}